

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O3

ScenarioUpperBound * __thiscall
despot::Adventurer::CreateScenarioUpperBound
          (Adventurer *this,string *name,string *particle_bound_name)

{
  pointer pcVar1;
  int iVar2;
  LookaheadUpperBound *this_00;
  ParticleUpperBound *pPVar3;
  TrivialParticleUpperBound *this_01;
  MDPUpperBound *this_02;
  ostream *poVar4;
  long *local_40 [2];
  long local_30 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)name);
  if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)name), iVar2 == 0)) {
    this_01 = (TrivialParticleUpperBound *)operator_new(0x10);
    despot::TrivialParticleUpperBound::TrivialParticleUpperBound(this_01,(DSPOMDP *)this);
    return (ScenarioUpperBound *)this_01;
  }
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
    this_02 = (MDPUpperBound *)operator_new(0x38);
    despot::MDPUpperBound::MDPUpperBound(this_02,&this->super_MDP,&this->super_StateIndexer);
    return (ScenarioUpperBound *)this_02;
  }
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
    this_00 = (LookaheadUpperBound *)operator_new(0x38);
    pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
    pPVar3 = (ParticleUpperBound *)(**(code **)(*(long *)this + 0x60))(this,local_40);
    despot::LookaheadUpperBound::LookaheadUpperBound
              (this_00,(DSPOMDP *)this,&this->super_StateIndexer,pPVar3);
    if (local_40[0] == local_30) {
      return (ScenarioUpperBound *)this_00;
    }
    operator_delete(local_40[0],local_30[0] + 1);
    return (ScenarioUpperBound *)this_00;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario upper bound: ");
  poVar4 = std::operator<<(poVar4,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(1);
}

Assistant:

ScenarioUpperBound* Adventurer::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "MDP") {
		return new MDPUpperBound(this, *this);
	} else if (name == "LOOKAHEAD") {
		return new LookaheadUpperBound(this, *this,
			CreateParticleUpperBound(particle_bound_name));
	} else {
		cerr << "Unsupported scenario upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}